

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall Parser::ExpectToken(Parser *this,Token expected,string *err)

{
  bool bVar1;
  Token t;
  char *pcVar2;
  string message;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  t = Lexer::ReadToken(&this->lexer_);
  bVar1 = true;
  if (t != expected) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"expected ",(allocator<char> *)&local_48);
    pcVar2 = Lexer::TokenName(expected);
    std::operator+(&local_68,&local_88,pcVar2);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,", got ",&local_89);
    pcVar2 = Lexer::TokenName(t);
    std::operator+(&local_88,&local_48,pcVar2);
    std::__cxx11::string::append((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_48);
    Lexer::TokenErrorHint(expected);
    std::__cxx11::string::append((char *)&local_68);
    bVar1 = Lexer::Error(&this->lexer_,&local_68,err);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return bVar1;
}

Assistant:

bool Parser::ExpectToken(Lexer::Token expected, string* err) {
  Lexer::Token token = lexer_.ReadToken();
  if (token != expected) {
    string message = string("expected ") + Lexer::TokenName(expected);
    message += string(", got ") + Lexer::TokenName(token);
    message += Lexer::TokenErrorHint(expected);
    return lexer_.Error(message, err);
  }
  return true;
}